

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O2

void Abc_NtkDropSatOutputs(Abc_Ntk_t *pNtk,Vec_Ptr_t *vCexes,int fVerbose)

{
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *pAVar2;
  void *pvVar3;
  int i;
  uint uVar4;
  
  if (vCexes->nSize != pNtk->vPos->nSize) {
    __assert_fail("Vec_PtrSize(vCexes) == Abc_NtkPoNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                  ,0x705,"void Abc_NtkDropSatOutputs(Abc_Ntk_t *, Vec_Ptr_t *, int)");
  }
  pAVar1 = Abc_AigConst1(pNtk);
  i = 0;
  uVar4 = 0;
  do {
    if (pNtk->vPos->nSize <= i) {
      if (fVerbose != 0) {
        printf("Logic cones of %d POs have been replaced by constant 0.\n",(ulong)uVar4);
      }
      Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
      return;
    }
    pAVar2 = Abc_NtkPo(pNtk,i);
    pvVar3 = Vec_PtrEntry(vCexes,i);
    if (pvVar3 != (void *)0x0) {
      Abc_ObjPatchFanin(pAVar2,(Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray],
                        (Abc_Obj_t *)
                        ((ulong)(*(uint *)&pAVar2->field_0x14 >> 10 & 1) ^ (ulong)pAVar1 ^ 1));
      pAVar2 = Abc_ObjChild0(pAVar2);
      if (pAVar2 != (Abc_Obj_t *)((ulong)pAVar1 ^ 1)) {
        __assert_fail("Abc_ObjChild0(pObj) == pConst0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                      ,0x70e,"void Abc_NtkDropSatOutputs(Abc_Ntk_t *, Vec_Ptr_t *, int)");
      }
      uVar4 = uVar4 + 1;
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Abc_NtkDropSatOutputs( Abc_Ntk_t * pNtk, Vec_Ptr_t * vCexes, int fVerbose )
{
    Abc_Obj_t * pObj, * pConst0, * pFaninNew;
    int i, Counter = 0;
    assert( Vec_PtrSize(vCexes) == Abc_NtkPoNum(pNtk) );
    pConst0 = Abc_ObjNot( Abc_AigConst1(pNtk) );
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        if ( Vec_PtrEntry( vCexes, i ) == NULL )
            continue;
        Counter++;
        pFaninNew = Abc_ObjNotCond( pConst0, Abc_ObjFaninC0(pObj) );
        Abc_ObjPatchFanin( pObj, Abc_ObjFanin0(pObj), pFaninNew );
        assert( Abc_ObjChild0(pObj) == pConst0 );
        // if a PO is driven by a latch, they have the same name...
//        if ( Abc_ObjIsBo(pObj) )
//            Nm_ManDeleteIdName( pNtk->pManName, Abc_ObjId(pObj) );
    }
    if ( fVerbose )
        printf( "Logic cones of %d POs have been replaced by constant 0.\n", Counter );
    Counter = Abc_AigCleanup( (Abc_Aig_t *)pNtk->pManFunc );
//    printf( "Cleanup removed %d nodes.\n", Counter );
}